

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

LogLevel cmake::StringToLogLevel(string *levelStr)

{
  pointer ppVar1;
  __type _Var2;
  int iVar3;
  LogLevel LVar4;
  pointer __lhs;
  long lVar5;
  pointer ppVar6;
  long lVar7;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>
  __l;
  allocator_type local_165;
  LogLevel local_164 [7];
  string levelStrLowCase;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_120;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_58;
  
  if ((StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_)
     , iVar3 != 0)) {
    local_164[6] = 1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
    ::pair<const_char_(&)[6],_cmake::LogLevel,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
                *)&levelStrLowCase,(char (*) [6])0x450af1,local_164 + 6);
    local_164[5] = 2;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
    ::pair<const_char_(&)[8],_cmake::LogLevel,_true>
              (&local_120,(char (*) [8])0x419802,local_164 + 5);
    local_164[4] = 3;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
    ::pair<const_char_(&)[7],_cmake::LogLevel,_true>(&local_f8,(char (*) [7])"notice",local_164 + 4)
    ;
    local_164[3] = 4;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
    ::pair<const_char_(&)[7],_cmake::LogLevel,_true>(&local_d0,(char (*) [7])0x44e40a,local_164 + 3)
    ;
    local_164[2] = 5;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
    ::pair<const_char_(&)[8],_cmake::LogLevel,_true>
              (&local_a8,(char (*) [8])"verbose",local_164 + 2);
    local_164[1] = 6;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
    ::pair<const_char_(&)[6],_cmake::LogLevel,_true>(&local_80,(char (*) [6])0x4154e1,local_164 + 1)
    ;
    local_164[0] = LOG_TRACE;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
    ::pair<const_char_(&)[6],_cmake::LogLevel,_true>(&local_58,(char (*) [6])0x419d39,local_164);
    __l._M_len = 7;
    __l._M_array = (iterator)&levelStrLowCase;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
    ::vector(&StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_,__l,&local_165);
    lVar7 = 0xf0;
    do {
      std::__cxx11::string::~string((string *)((long)&levelStrLowCase._M_dataplus._M_p + lVar7));
      lVar7 = lVar7 + -0x28;
    } while (lVar7 != -0x28);
    __cxa_atexit(std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
                 ::~vector,&StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_);
  }
  cmsys::SystemTools::LowerCase(&levelStrLowCase,levelStr);
  ppVar1 = StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  __lhs = StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  for (lVar5 = lVar7 / 0x28 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    _Var2 = std::operator==(&__lhs->first,&levelStrLowCase);
    ppVar6 = __lhs;
    if (_Var2) goto LAB_0015b444;
    _Var2 = std::operator==(&__lhs[1].first,&levelStrLowCase);
    ppVar6 = __lhs + 1;
    if (_Var2) goto LAB_0015b444;
    _Var2 = std::operator==(&__lhs[2].first,&levelStrLowCase);
    ppVar6 = __lhs + 2;
    if (_Var2) goto LAB_0015b444;
    _Var2 = std::operator==(&__lhs[3].first,&levelStrLowCase);
    ppVar6 = __lhs + 3;
    if (_Var2) goto LAB_0015b444;
    __lhs = __lhs + 4;
    lVar7 = lVar7 + -0xa0;
  }
  lVar7 = lVar7 / 0x28;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      ppVar6 = ppVar1;
      if ((lVar7 != 3) ||
         (_Var2 = std::operator==(&__lhs->first,&levelStrLowCase), ppVar6 = __lhs, _Var2))
      goto LAB_0015b444;
      __lhs = __lhs + 1;
    }
    _Var2 = std::operator==(&__lhs->first,&levelStrLowCase);
    ppVar6 = __lhs;
    if (_Var2) goto LAB_0015b444;
    __lhs = __lhs + 1;
  }
  _Var2 = std::operator==(&__lhs->first,&levelStrLowCase);
  ppVar6 = ppVar1;
  if (_Var2) {
    ppVar6 = __lhs;
  }
LAB_0015b444:
  if (ppVar6 == StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    LVar4 = LOG_UNDEFINED;
  }
  else {
    LVar4 = ppVar6->second;
  }
  std::__cxx11::string::~string((string *)&levelStrLowCase);
  return LVar4;
}

Assistant:

cmake::LogLevel cmake::StringToLogLevel(const std::string& levelStr)
{
  using LevelsPair = std::pair<std::string, LogLevel>;
  static const std::vector<LevelsPair> levels = {
    { "error", LogLevel::LOG_ERROR },     { "warning", LogLevel::LOG_WARNING },
    { "notice", LogLevel::LOG_NOTICE },   { "status", LogLevel::LOG_STATUS },
    { "verbose", LogLevel::LOG_VERBOSE }, { "debug", LogLevel::LOG_DEBUG },
    { "trace", LogLevel::LOG_TRACE }
  };

  const auto levelStrLowCase = cmSystemTools::LowerCase(levelStr);

  const auto it = std::find_if(levels.cbegin(), levels.cend(),
                               [&levelStrLowCase](const LevelsPair& p) {
                                 return p.first == levelStrLowCase;
                               });
  return (it != levels.cend()) ? it->second : LogLevel::LOG_UNDEFINED;
}